

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::BaseAssembler::section(BaseAssembler *this,Section *section)

{
  CodeHolder *pCVar1;
  Logger *this_00;
  uint8_t *puVar2;
  Error EVar3;
  float in_XMM0_Da;
  
  pCVar1 = (this->super_BaseEmitter)._code;
  if (pCVar1 == (CodeHolder *)0x0) {
    EVar3 = 5;
  }
  else {
    if ((section->_id < *(uint *)&pCVar1->field_0xe0) &&
       (*(Section **)(*(long *)&pCVar1->_sections + (ulong)section->_id * 8) == section)) {
      this_00 = (this->super_BaseEmitter)._logger;
      if (this_00 != (Logger *)0x0) {
        Logger::logf(this_00,in_XMM0_Da);
      }
      puVar2 = (section->_buffer)._data;
      this->_section = section;
      this->_bufferData = puVar2;
      this->_bufferPtr = puVar2 + (section->_buffer)._size;
      this->_bufferEnd = puVar2 + (section->_buffer)._capacity;
      return 0;
    }
    EVar3 = 0x13;
  }
  EVar3 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar3,(char *)0x0);
  return EVar3;
}

Assistant:

Error BaseAssembler::section(Section* section) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  if (!_code->isSectionValid(section->id()) || _code->_sections[section->id()] != section)
    return reportError(DebugUtils::errored(kErrorInvalidSection));

#ifndef ASMJIT_NO_LOGGING
  if (_logger)
    _logger->logf(".section %s {#%u}\n", section->name(), section->id());
#endif

  BaseAssembler_initSection(this, section);
  return kErrorOk;
}